

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmObjGramProd::delete_alt(CVmObjGramProd *this,size_t idx)

{
  vmgram_alt_info *pvVar1;
  vm_gram_ext *pvVar2;
  long in_RSI;
  CVmObjGramProd *in_RDI;
  long local_10;
  
  local_10 = in_RSI;
  while( true ) {
    pvVar2 = get_ext(in_RDI);
    if (pvVar2->alt_cnt_ <= local_10 + 1U) break;
    pvVar2 = get_ext(in_RDI);
    pvVar1 = pvVar2->alts_[local_10 + 1];
    pvVar2 = get_ext(in_RDI);
    pvVar2->alts_[local_10] = pvVar1;
    local_10 = local_10 + 1;
  }
  pvVar2 = get_ext(in_RDI);
  pvVar2->alt_cnt_ = pvVar2->alt_cnt_ - 1;
  pvVar2 = get_ext(in_RDI);
  pvVar2->field_0x14 = pvVar2->field_0x14 & 0xfe | 1;
  return;
}

Assistant:

void CVmObjGramProd::delete_alt(size_t idx)
{
    /* remove it from the array and close the gap */
    for ( ; idx + 1 < get_ext()->alt_cnt_ ; ++idx)
        get_ext()->alts_[idx] = get_ext()->alts_[idx+1];

    /* adjust the count */
    get_ext()->alt_cnt_ -= 1;

    /* we've been modified since load time */
    get_ext()->modified_ = TRUE;
}